

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

void Iso_ManStop(Iso_Man_t *p,int fVerbose)

{
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  double local_28;
  int fVerbose_local;
  Iso_Man_t *p_local;
  
  if (fVerbose != 0) {
    p->timeOther = (p->timeTotal - p->timeHash) - p->timeFout;
    Abc_Print(1,"%s =","Building ");
    if (p->timeTotal == 0) {
      local_28 = 0.0;
    }
    else {
      local_28 = ((double)p->timeFout * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeFout * 1.0) / 1000000.0,local_28);
    Abc_Print(1,"%s =","Hashing  ");
    if (p->timeTotal == 0) {
      local_38 = 0.0;
    }
    else {
      local_38 = ((double)(p->timeHash - p->timeSort) * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(p->timeHash - p->timeSort) * 1.0) / 1000000.0,
              local_38);
    Abc_Print(1,"%s =","Sorting  ");
    if (p->timeTotal == 0) {
      local_48 = 0.0;
    }
    else {
      local_48 = ((double)p->timeSort * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSort * 1.0) / 1000000.0,local_48);
    Abc_Print(1,"%s =","Other    ");
    if (p->timeTotal == 0) {
      local_58 = 0.0;
    }
    else {
      local_58 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_58);
    Abc_Print(1,"%s =","TOTAL    ");
    if (p->timeTotal == 0) {
      local_68 = 0.0;
    }
    else {
      local_68 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_68);
  }
  Vec_PtrFree(p->vTemp1);
  Vec_PtrFree(p->vTemp2);
  Vec_PtrFree(p->vClasses);
  Vec_PtrFree(p->vSingles);
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  if (p->pObjs != (Iso_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Iso_Obj_t *)0x0;
  }
  if (p != (Iso_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Iso_ManStop( Iso_Man_t * p, int fVerbose )
{
    if ( fVerbose )
    {
        p->timeOther = p->timeTotal - p->timeHash - p->timeFout;
        ABC_PRTP( "Building ", p->timeFout,               p->timeTotal );
        ABC_PRTP( "Hashing  ", p->timeHash-p->timeSort,   p->timeTotal );
        ABC_PRTP( "Sorting  ", p->timeSort,               p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther,              p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal,              p->timeTotal );
    }
    Vec_PtrFree( p->vTemp1 );
    Vec_PtrFree( p->vTemp2 );
    Vec_PtrFree( p->vClasses );
    Vec_PtrFree( p->vSingles );
    ABC_FREE( p->pBins );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}